

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_main.cpp
# Opt level: O2

void printHelp(BenchFuction test)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (test == bench_none) {
    pcVar2 = "\n see: ./benchmark <function> help\n";
    local_50 = 
    "functions: makegrid, loadneeded, evaluate(-mixed), differentiate, iweights, refine\n";
    local_60 = "\nusage: ./benchmark <function> <parameters>\n\n";
  }
  else {
    pcVar6 = "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
    pcVar2 = "type  : level, iptotal, etc.; ignored if not used by the grid\n";
    pcVar3 = "depth : grid density\n";
    pcVar5 = "dims  : number of dimensions\n";
    pcVar1 = "grid  : global, sequence, localp, wavelet, fourier\n";
    if (test == bench_make) {
      local_50 = "aniso : (optional) list of anisotropic weights and level limits\n";
      local_60 = "jumps : how many times to increment <depth> by 1\n";
      pcVar7 = 
      "\nusage: ./benchmark makegrid <grid> <dims> <depth> <type> <rule> <iters> <jumps> <aniso>\n\n"
      ;
      local_58 = "iters : number of times to repeat the function call\n";
    }
    else {
      if (test == bench_loadneeded) {
        local_60 = "grid  : global, sequence, localp, wavelet, fourier\n";
        local_38 = "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        local_58 = "iters : number of times to repeat the function call\n";
        local_40 = "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        local_50 = 
        "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n"
        ;
        pcVar6 = "jumps : how many times to double <outs>\n";
        local_48 = "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        pcVar2 = "outs  : number of outputs\n";
        pcVar7 = 
        "\nusage: ./benchmark loadneeded <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps> <acc> <gpu> <extra>\n\n"
        ;
LAB_0010b3c6:
        std::operator<<((ostream *)&std::cout,pcVar7);
        std::operator<<((ostream *)&std::cout,local_60);
        local_60 = "gpu   : cuda device ID; ignored for cpu acceleration\n";
        pcVar4 = "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        pcVar7 = pcVar3;
LAB_0010b3fe:
        std::operator<<((ostream *)&std::cout,pcVar5);
        pcVar1 = local_38;
      }
      else {
        if (test - bench_evaluate < 2) {
          local_50 = 
          "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n"
          ;
          pcVar6 = "jumps : how many times to double <outs>\n";
          local_58 = "iters : number of times to repeat the function call\n";
          local_48 = "batch : number of points to use for the evaluate command\n";
          local_40 = "order : -1, 0, 1, 2; ignored if not used by the grid\n";
          local_38 = "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n"
          ;
          pcVar3 = "type  : level, iptotal, etc.; ignored if not used by the grid\n";
          pcVar2 = "depth : grid density\n";
          pcVar5 = "outs  : number of outputs\n";
          local_60 = "dims  : number of dimensions\n";
          pcVar7 = "grid  : global, sequence, localp, wavelet, fourier\n";
          pcVar1 = 
          "\nusage: ./benchmark evaluate <grid> <dims> <outs> <depth> <type> <rule> <order> <batch> <iters> <jumps> <acc> <gpu> <extra>\n\n"
          ;
LAB_0010b3ba:
          std::operator<<((ostream *)&std::cout,pcVar1);
          goto LAB_0010b3c6;
        }
        pcVar4 = "iters : number of times to repeat the function call\n";
        pcVar6 = "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        pcVar1 = "dims  : number of dimensions\n";
        pcVar2 = "grid  : global, sequence, localp, wavelet, fourier\n";
        if (test == bench_differentiate) {
          local_48 = "type  : level, iptotal, etc.; ignored if not used by the grid\n";
          local_40 = "depth : grid density\n";
          local_50 = 
          "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n"
          ;
          local_60 = "jumps : how many times to double <outs>\n";
          local_58 = "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n"
          ;
          local_38 = "outs  : number of outputs\n";
          pcVar5 = 
          "\nusage: ./benchmark differentiate <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps>\n\n"
          ;
          pcVar7 = pcVar1;
          goto LAB_0010b3fe;
        }
        if (test != bench_iweights) {
          if (test != bench_refine) goto LAB_0010b4c7;
          std::operator<<((ostream *)&std::cout,
                          "\nusage: ./benchmark refine <grid> <dims> <outs> <depth> <type> <rule> <order> <ref-type-depth> <min-growth> <surp-tolerance> <surp-criteria> <output> <iters> <acc> <gpu> <extra>\n\n"
                         );
          std::operator<<((ostream *)&std::cout,
                          "grid  : global, sequence, localp, wavelet, fourier\n");
          std::operator<<((ostream *)&std::cout,"dims  : number of dimensions\n");
          local_50 = "extra : (optional) list of anisotropic weights and level limits\n";
          pcVar6 = "iters : number of times to repeat the function call\n";
          local_58 = "output         : (all refinement) output to use in the refinement\n\n";
          local_48 = "surp-criteria  : (surplus refinement) selection criteria, e.g., stable, fds\n"
          ;
          local_40 = "surp-tolerance : (surplus refinement) tolerance\n";
          local_38 = 
          "min-growth     : (anisotropic refinement) minumum number of refinement points, use 0 to switch to surplus refinement\n"
          ;
          pcVar3 = 
          "ref-type-depth : (anisotropic refinement) refinement type, e.g., iptotal, ipcurved\n";
          pcVar2 = "order : -1, 0, 1, 2; ignored if not used by the grid\n\n";
          pcVar5 = "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
          local_60 = "type  : level, iptotal, etc.; ignored if not used by the grid\n";
          pcVar7 = "depth : grid density\n";
          pcVar1 = "outs  : number of outputs\n";
          goto LAB_0010b3ba;
        }
        local_48 = "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        pcVar7 = "grid  : global, sequence, localp, wavelet, fourier\n";
        local_40 = "depth : grid density\n";
        local_50 = "aniso : (optional) list of anisotropic weights and level limits\n";
        local_60 = "jumps : how many times to increase <depth> by 1\n";
        local_58 = "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and Fourier grids\n";
        pcVar2 = 
        "\nusage: ./benchmark iweights <grid> <dims> <depth> <type> <rule> <order> <iters> <jumps> <aniso>\n\n"
        ;
      }
      std::operator<<((ostream *)&std::cout,pcVar2);
      pcVar2 = local_58;
      pcVar3 = local_48;
      pcVar5 = local_40;
      local_58 = pcVar4;
    }
    std::operator<<((ostream *)&std::cout,pcVar7);
    std::operator<<((ostream *)&std::cout,pcVar1);
    std::operator<<((ostream *)&std::cout,pcVar5);
    std::operator<<((ostream *)&std::cout,pcVar3);
    std::operator<<((ostream *)&std::cout,pcVar2);
    std::operator<<((ostream *)&std::cout,pcVar6);
    std::operator<<((ostream *)&std::cout,local_58);
    pcVar2 = "      : anisotropic weights come first (if used by the grid), then level limits\n";
  }
  std::operator<<((ostream *)&std::cout,local_60);
  std::operator<<((ostream *)&std::cout,local_50);
  std::operator<<((ostream *)&std::cout,pcVar2);
LAB_0010b4c7:
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void printHelp(BenchFuction test){
    if (test == bench_none){
        cout << "\nusage: ./benchmark <function> <parameters>\n\n";
        cout << "functions: makegrid, loadneeded, evaluate(-mixed), differentiate, iweights, refine\n";
        cout << "\n see: ./benchmark <function> help\n";
    }else if (test == bench_make){
        cout << "\nusage: ./benchmark makegrid <grid> <dims> <depth> <type> <rule> <iters> <jumps> <aniso>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to increment <depth> by 1\n";
        cout << "aniso : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_loadneeded){
        cout << "\nusage: ./benchmark loadneeded <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_evaluate || test == bench_evaluate_mixed){
        cout << "\nusage: ./benchmark evaluate <grid> <dims> <outs> <depth> <type> <rule> <order> <batch> <iters> <jumps> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "batch : number of points to use for the evaluate command\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_differentiate){
        cout << "\nusage: ./benchmark differentiate <grid> <dims> <outs> <depth> <type> <rule> <order> <iters> <jumps>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to double <outs>\n";
        cout << "extra : (optional) sparse/dense flavor and/or list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_iweights){
        cout << "\nusage: ./benchmark iweights <grid> <dims> <depth> <type> <rule> <order> <iters> <jumps> <aniso>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and Fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n";
        cout << "iters : number of times to repeat the function call\n";
        cout << "jumps : how many times to increase <depth> by 1\n";
        cout << "aniso : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }else if (test == bench_refine){
        cout << "\nusage: ./benchmark refine <grid> <dims> <outs> <depth> <type> <rule> <order> <ref-type-depth> <min-growth> <surp-tolerance> <surp-criteria> <output> <iters> <acc> <gpu> <extra>\n\n";
        cout << "grid  : global, sequence, localp, wavelet, fourier\n";
        cout << "dims  : number of dimensions\n";
        cout << "outs  : number of outputs\n";
        cout << "depth : grid density\n";
        cout << "type  : level, iptotal, etc.; ignored if not used by the grid\n";
        cout << "rule  : rleja, clenshaw-curtis, etc.; ignored for wavelet and fourier grids\n";
        cout << "order : -1, 0, 1, 2; ignored if not used by the grid\n\n";

        cout << "ref-type-depth : (anisotropic refinement) refinement type, e.g., iptotal, ipcurved\n";
        cout << "min-growth     : (anisotropic refinement) minumum number of refinement points, use 0 to switch to surplus refinement\n";
        cout << "surp-tolerance : (surplus refinement) tolerance\n";
        cout << "surp-criteria  : (surplus refinement) selection criteria, e.g., stable, fds\n";
        cout << "output         : (all refinement) output to use in the refinement\n\n";

        cout << "iters : number of times to repeat the function call\n";
        cout << "acc   : acceleration type, e.g., gpu-cuda, cpu-blas, none, etc.\n";
        cout << "gpu   : cuda device ID; ignored for cpu acceleration\n";
        cout << "extra : (optional) list of anisotropic weights and level limits\n";
        cout << "      : anisotropic weights come first (if used by the grid), then level limits\n";
    }
    cout << endl;
}